

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

int Curl_resolv(connectdata *conn,char *hostname,int port,Curl_dns_entry **entry)

{
  Curl_easy *data;
  bool bVar1;
  _Bool _Var2;
  CURLcode CVar3;
  Curl_addrinfo *addr;
  uint uVar4;
  Curl_dns_entry *dns;
  int respwait;
  Curl_dns_entry *local_40;
  int local_38;
  int local_34;
  
  local_40 = (Curl_dns_entry *)0x0;
  data = conn->data;
  *entry = (Curl_dns_entry *)0x0;
  if (data->share != (Curl_share *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
  }
  local_40 = fetch_addr(conn,hostname,port);
  if (local_40 == (Curl_dns_entry *)0x0) {
    uVar4 = 0xffffffff;
  }
  else {
    uVar4 = 0;
    Curl_infof(data,"Hostname %s was found in DNS cache\n",hostname);
    local_40->inuse = local_40->inuse + 1;
  }
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
  }
  if (local_40 != (Curl_dns_entry *)0x0) goto LAB_0010b827;
  _Var2 = Curl_ipvalid(conn);
  if (_Var2) {
    if ((data->set).resolver_start != (curl_resolver_start_callback)0x0) {
      Curl_set_in_callback(data,true);
      local_34 = (*(data->set).resolver_start)
                           ((data->state).resolver,(void *)0x0,(data->set).resolver_start_client);
      Curl_set_in_callback(data,false);
      if (local_34 != 0) goto LAB_0010b81a;
    }
    if ((data->set).doh == true) {
      addr = Curl_doh(conn,hostname,port,&local_38);
    }
    else {
      addr = Curl_getaddrinfo(conn,hostname,port,&local_38);
    }
    if (addr == (Curl_addrinfo *)0x0) {
      bVar1 = true;
      if (local_38 != 0) {
        CVar3 = Curl_resolv_check(conn,&local_40);
        if (CVar3 != CURLE_OK) goto LAB_0010b81a;
        uVar4 = (uint)(local_40 == (Curl_dns_entry *)0x0);
      }
    }
    else {
      if (data->share != (Curl_share *)0x0) {
        Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      local_40 = Curl_cache_addr(data,addr,hostname,port);
      if (data->share != (Curl_share *)0x0) {
        Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
      }
      bVar1 = true;
      if (local_40 == (Curl_dns_entry *)0x0) {
        Curl_freeaddrinfo(addr);
      }
      else {
        uVar4 = 0;
      }
    }
  }
  else {
LAB_0010b81a:
    bVar1 = false;
  }
  if (!bVar1) {
    return -1;
  }
LAB_0010b827:
  *entry = local_40;
  return uVar4;
}

Assistant:

int Curl_resolv(struct connectdata *conn,
                const char *hostname,
                int port,
                struct Curl_dns_entry **entry)
{
  struct Curl_dns_entry *dns = NULL;
  struct Curl_easy *data = conn->data;
  CURLcode result;
  int rc = CURLRESOLV_ERROR; /* default to failure */

  *entry = NULL;

  if(data->share)
    Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

  dns = fetch_addr(conn, hostname, port);

  if(dns) {
    infof(data, "Hostname %s was found in DNS cache\n", hostname);
    dns->inuse++; /* we use it! */
    rc = CURLRESOLV_RESOLVED;
  }

  if(data->share)
    Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

  if(!dns) {
    /* The entry was not in the cache. Resolve it to IP address */

    Curl_addrinfo *addr;
    int respwait;

    /* Check what IP specifics the app has requested and if we can provide it.
     * If not, bail out. */
    if(!Curl_ipvalid(conn))
      return CURLRESOLV_ERROR;

    /* notify the resolver start callback */
    if(data->set.resolver_start) {
      int st;
      Curl_set_in_callback(data, true);
      st = data->set.resolver_start(data->state.resolver, NULL,
                                    data->set.resolver_start_client);
      Curl_set_in_callback(data, false);
      if(st)
        return CURLRESOLV_ERROR;
    }

    if(data->set.doh) {
      addr = Curl_doh(conn, hostname, port, &respwait);
    }
    else {
      /* If Curl_getaddrinfo() returns NULL, 'respwait' might be set to a
         non-zero value indicating that we need to wait for the response to the
         resolve call */
      addr = Curl_getaddrinfo(conn,
#ifdef DEBUGBUILD
                              (data->set.str[STRING_DEVICE]
                               && !strcmp(data->set.str[STRING_DEVICE],
                                          "LocalHost"))?"localhost":
#endif
                              hostname, port, &respwait);
    }
    if(!addr) {
      if(respwait) {
        /* the response to our resolve call will come asynchronously at
           a later time, good or bad */
        /* First, check that we haven't received the info by now */
        result = Curl_resolv_check(conn, &dns);
        if(result) /* error detected */
          return CURLRESOLV_ERROR;
        if(dns)
          rc = CURLRESOLV_RESOLVED; /* pointer provided */
        else
          rc = CURLRESOLV_PENDING; /* no info yet */
      }
    }
    else {
      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, addr, hostname, port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns)
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(addr);
      else
        rc = CURLRESOLV_RESOLVED;
    }
  }

  *entry = dns;

  return rc;
}